

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

int main(void)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  bool bVar6;
  int iVar7;
  int iVar8;
  ImU32 col;
  GLFWwindow *handle;
  GLubyte *__s;
  size_t sVar9;
  ImGuiIO *pIVar10;
  size_t sVar11;
  float2 *pfVar12;
  bool *pbVar13;
  State *other;
  ImDrawList *this;
  ImDrawData *draw_data;
  long lVar14;
  size_t i_1;
  char *pcVar15;
  size_t i;
  size_t sVar16;
  uint uVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  double mouse_y;
  double mouse_x;
  ImVec2 local_f8;
  ImVec2 local_f0;
  double local_e8;
  double local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  float2 local_c8;
  undefined8 uStack_c0;
  float2 local_b8;
  undefined8 uStack_b0;
  State local_a8;
  
  iVar7 = glfwInit();
  iVar8 = 1;
  if (iVar7 != 0) {
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,3);
    glfwWindowHint(0x22008,0x32001);
    handle = glfwCreateWindow(0x280,0x1e0,"My Title",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      glfwSwapInterval(1);
      gladLoadGLLoader(glfwGetProcAddress);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OpenGL: ",8);
      __s = (*glad_glGetString)(0x1f02);
      if (__s == (GLubyte *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1da1c8);
      }
      else {
        sVar9 = strlen((char *)__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      ImGui::CreateContext((ImFontAtlas *)0x0);
      ImGui::StyleColorsDark((ImGuiStyle *)0x0);
      ImGui_ImplGlfw_InitForOpenGL(handle,true);
      ImGui_ImplOpenGL3_Init((char *)0x0);
      State::add_box(&state,(float2)0x42c8000042c80000);
      State::add_box(&state,(float2)0x4348000043c80000);
      push_undo_step();
      iVar7 = glfwWindowShouldClose(handle);
      if (iVar7 == 0) {
        bVar6 = false;
        do {
          glfwPollEvents();
          glfwGetCursorPos(handle,&local_e0,&local_e8);
          local_d8 = CONCAT44((float)local_e8,(float)local_e0);
          uStack_d0 = local_d8;
          pIVar10 = ImGui::GetIO();
          bVar1 = pIVar10->WantCaptureMouse;
          if (bVar1 == false) {
            iVar7 = glfwGetMouseButton(handle,0);
            if (iVar7 == 1) {
              sVar11 = bas::Vector<float2,_4UL,_bas::RawAllocator>::size(&state.box_positions);
              if (sVar11 != 0) {
                sVar16 = 0;
                do {
                  pfVar12 = bas::Vector<float2,_4UL,_bas::RawAllocator>::operator[]
                                      (&state.box_positions,sVar16);
                  fVar19 = (*pfVar12).x;
                  fVar20 = box_size.x + fVar19;
                  fVar22 = (*pfVar12).y;
                  fVar21 = box_size.y + fVar22;
                  uVar17 = -(uint)(fVar20 < fVar19);
                  uVar18 = -(uint)(fVar21 < fVar22);
                  auVar23._0_4_ = ~uVar17 & (uint)fVar20;
                  auVar23._4_4_ = ~uVar18 & (uint)fVar21;
                  auVar23._8_4_ = ~uVar17 & (uint)fVar19;
                  auVar23._12_4_ = ~uVar18 & (uint)fVar22;
                  auVar2._4_4_ = (uint)fVar22 & uVar18;
                  auVar2._0_4_ = (uint)fVar19 & uVar17;
                  auVar2._8_4_ = (uint)fVar20 & uVar17;
                  auVar2._12_4_ = (uint)fVar21 & uVar18;
                  auVar23 = auVar23 | auVar2;
                  auVar25._4_4_ = -(uint)(local_d8._4_4_ <= auVar23._4_4_);
                  auVar25._0_4_ = -(uint)((float)local_d8 <= auVar23._0_4_);
                  auVar3._4_8_ = auVar23._8_8_;
                  auVar3._0_4_ = -(uint)(auVar23._4_4_ <= local_d8._4_4_);
                  auVar24._0_8_ = auVar3._0_8_ << 0x20;
                  auVar24._8_4_ = -(uint)(auVar23._8_4_ <= (float)uStack_d0);
                  auVar24._12_4_ = -(uint)(auVar23._12_4_ <= uStack_d0._4_4_);
                  auVar25._8_8_ = auVar24._8_8_;
                  iVar7 = movmskps((int)pfVar12,auVar25);
                  if (iVar7 == 0xf) {
                    pbVar13 = bas::Vector<bool,_4UL,_bas::RawAllocator>::operator[]
                                        (&state.box_selections,sVar16);
                    *pbVar13 = true;
                  }
                  sVar16 = sVar16 + 1;
                } while (sVar11 != sVar16);
              }
            }
          }
          iVar7 = glfwGetKey(handle,0x5a);
          iVar8 = glfwGetKey(handle,0x155);
          if ((!bVar6 && iVar8 == 1) && iVar7 == 1) {
            sVar11 = bas::Vector<State,_4UL,_bas::RawAllocator>::size(&undo_stack.m_elements);
            if (sVar11 < 2) {
              lVar14 = 0x12;
              pcVar15 = "End of undo stack\n";
            }
            else {
              bas::Vector<State,_4UL,_bas::RawAllocator>::pop_last(&local_a8,&undo_stack.m_elements)
              ;
              bas::Vector<bool,_4UL,_bas::RawAllocator>::~Vector(&local_a8.box_selections);
              bas::Vector<float2,_4UL,_bas::RawAllocator>::~Vector(&local_a8.box_positions);
              other = bas::Stack<State,_4UL,_bas::RawAllocator>::peek(&undo_stack);
              if (other != &state) {
                bas::Vector<float2,_4UL,_bas::RawAllocator>::~Vector(&state.box_positions);
                bas::Vector<float2,4ul,bas::RawAllocator>::init_copy_from_other_vector<4ul>
                          ((Vector<float2,4ul,bas::RawAllocator> *)&state,&other->box_positions);
                bas::Vector<bool,_4UL,_bas::RawAllocator>::~Vector(&state.box_selections);
                bas::Vector<bool,4ul,bas::RawAllocator>::init_copy_from_other_vector<4ul>
                          ((Vector<bool,4ul,bas::RawAllocator> *)&state.box_selections,
                           &other->box_selections);
              }
              state.a = other->a;
              lVar14 = 0xe;
              pcVar15 = "Pop undo step\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar15,lVar14)
            ;
          }
          ImGui_ImplOpenGL3_NewFrame();
          ImGui_ImplGlfw_NewFrame();
          ImGui::NewFrame();
          this = ImGui::GetBackgroundDrawList();
          sVar11 = bas::Vector<float2,_4UL,_bas::RawAllocator>::size(&state.box_positions);
          if (sVar11 != 0) {
            sVar16 = 0;
            do {
              pfVar12 = bas::Vector<float2,_4UL,_bas::RawAllocator>::operator[]
                                  (&state.box_positions,sVar16);
              local_c8 = *pfVar12;
              uStack_c0 = 0;
              local_b8 = box_size;
              uStack_b0 = 0;
              local_a8.box_positions.m_begin = (float2 *)0x3ea0a0a13f66e6e8;
              local_a8.box_positions.m_end = (float2 *)0x3f8000003ea0a0a1;
              pbVar13 = bas::Vector<bool,_4UL,_bas::RawAllocator>::operator[]
                                  (&state.box_selections,sVar16);
              if (*pbVar13 == true) {
                local_a8.box_positions.m_begin =
                     (float2 *)
                     CONCAT44(local_a8.box_positions.m_begin._4_4_,
                              local_a8.box_positions.m_begin._0_4_ * 0.6);
              }
              fVar21 = local_c8.x;
              fVar29 = local_c8.y;
              fVar22 = local_b8.x + fVar21;
              fVar20 = local_b8.y + fVar29;
              uVar17 = -(uint)(fVar22 < fVar21);
              uVar18 = -(uint)(fVar20 < fVar29);
              local_f8.x = (float)(~uVar17 & (uint)fVar22 | (uint)fVar21 & uVar17);
              fVar19 = (float)(~uVar18 & (uint)fVar20 | (uint)fVar29 & uVar18);
              fVar22 = (float)(~uVar17 & (uint)fVar21 | (uint)fVar22 & uVar17);
              fVar20 = (float)(~uVar18 & (uint)fVar29 | (uint)fVar20 & uVar18);
              if (bVar1 == false) {
                auVar4._4_4_ = local_c8.x;
                auVar4._8_4_ = local_c8.y;
                auVar4._0_4_ = fVar19;
                auVar26._0_8_ = auVar4._0_8_ << 0x20;
                auVar26._8_4_ = fVar22;
                auVar26._12_4_ = fVar20;
                auVar5._4_8_ = auVar26._8_8_;
                auVar5._0_4_ = -(uint)(fVar19 <= local_d8._4_4_);
                auVar27._0_8_ = auVar5._0_8_ << 0x20;
                auVar27._8_4_ = -(uint)(fVar22 <= (float)uStack_d0);
                auVar27._12_4_ = -(uint)(fVar20 <= uStack_d0._4_4_);
                auVar28._4_4_ = -(uint)(local_d8._4_4_ <= fVar19);
                auVar28._0_4_ = -(uint)((float)local_d8 <= local_f8.x);
                auVar28._8_8_ = auVar27._8_8_;
                iVar8 = movmskps((int)pbVar13,auVar28);
                if (iVar8 == 0xf) {
                  local_a8.box_positions.m_begin =
                       (float2 *)
                       CONCAT44(local_a8.box_positions.m_begin._4_4_,
                                local_a8.box_positions.m_begin._0_4_ * 0.8);
                }
              }
              local_f0.y = fVar19;
              local_f0.x = fVar22;
              local_f8.y = fVar20;
              col = ImGui::ColorConvertFloat4ToU32((ImVec4 *)&local_a8);
              ImDrawList::AddRectFilled(this,&local_f0,&local_f8,col,0.0,0xf);
              sVar16 = sVar16 + 1;
            } while (sVar11 != sVar16);
          }
          ImGui::Begin("Other Window",(bool *)0x0,0);
          ImGui::SliderInt("A",&state.a,0,100,"%d");
          bVar6 = ImGui::IsItemDeactivatedAfterEdit();
          if (bVar6) {
            push_undo_step();
          }
          ImGui::End();
          ImGui::Render();
          (*glad_glClear)(0x4100);
          draw_data = ImGui::GetDrawData();
          ImGui_ImplOpenGL3_RenderDrawData(draw_data);
          glfwSwapBuffers(handle);
          iVar8 = glfwWindowShouldClose(handle);
          bVar6 = iVar7 == 1;
        } while (iVar8 == 0);
      }
      ImGui_ImplGlfw_Shutdown();
      glfwDestroyWindow(handle);
      glfwTerminate();
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

int main()
{
    if (!glfwInit()) {
        return 1;
    }

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

    GLFWwindow *window = glfwCreateWindow(
        640, 480, "My Title", nullptr, nullptr);
    if (window == nullptr) {
        return 1;
    }
    glfwMakeContextCurrent(window);
    glfwSwapInterval(1);

    gladLoadGLLoader((GLADloadproc)glfwGetProcAddress);
    std::cout << "OpenGL: " << glGetString(GL_VERSION) << "\n";

    ImGui::CreateContext();
    ImGui::StyleColorsDark();
    ImGui_ImplGlfw_InitForOpenGL(window, true);
    ImGui_ImplOpenGL3_Init(nullptr);

    bool z_was_down = false;

    // double last_mouse_x = 0.0f;
    // double last_mouse_y = 0.0f;

    state.add_box({100, 100});
    state.add_box({400, 200});
    push_undo_step();

    while (!glfwWindowShouldClose(window)) {
        glfwPollEvents();

        double mouse_x, mouse_y;
        glfwGetCursorPos(window, &mouse_x, &mouse_y);
        float2 mouse_position = {(float)mouse_x, (float)mouse_y};

        bool imgui_uses_mouse = ImGui::GetIO().WantCaptureMouse;

        if (!imgui_uses_mouse) {
            if (glfwGetMouseButton(window, GLFW_MOUSE_BUTTON_LEFT) ==
                GLFW_PRESS) {
                for (size_t i : state.box_positions.index_range()) {
                    if (state.get_box_rect(i).contains(mouse_position)) {
                        state.box_selections[i] = true;
                    }
                }
            }
        }

        bool z_is_down = is_key_down(window, GLFW_KEY_Z);

        if (is_key_down(window, GLFW_KEY_LEFT_CONTROL) && !z_was_down &&
            z_is_down) {
            pop_undo_step();
        }

        ImGui_ImplOpenGL3_NewFrame();
        ImGui_ImplGlfw_NewFrame();

        ImGui::NewFrame();

        {
            ImDrawList *draw_list = ImGui::GetBackgroundDrawList();
            for (size_t i : state.box_positions.index_range()) {
                rectf box = state.get_box_rect(i);
                ImColor color = ImColor(230, 80, 80);
                if (state.box_selections[i]) {
                    color.Value.x *= 0.6f;
                }
                if (!imgui_uses_mouse && box.contains(mouse_position)) {
                    color.Value.x *= 0.8f;
                }

                draw_list->AddRectFilled(
                    to_im(box.upper_left()), to_im(box.lower_right()), color);
            }
        }

        // ImGui::SetNextWindowPos({0, 0});
        // int width, height;
        // glfwGetWindowSize(window, &width, &height);
        // ImGui::SetNextWindowSize({(float)width, (float)height});
        // ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 0.0f);

        // ImGui::Begin("My Window",
        //              nullptr,
        //              ImGuiWindowFlags_NoDecoration |
        //                  ImGuiWindowFlags_NoBringToFrontOnFocus |
        //                  ImGuiWindowFlags_NoInputs);

        // // rect_pos_x = mouse_x;
        // ImDrawList *draw_list = ImGui::GetWindowDrawList();
        // if (!ImGui::GetIO().WantCaptureMouse &&
        //     glfwGetMouseButton(window, GLFW_MOUSE_BUTTON_LEFT) ==
        //     GLFW_PRESS) { BAS_UNUSED_VAR(last_mouse_y); rect_pos_x +=
        //     mouse_x - last_mouse_x;
        // }

        // draw_list->AddRectFilled({rect_pos_x, 10},
        //                          {rect_pos_x + 100, 200},
        //                          ImColor(0.8f, 0.8f, 0.3f));
        // const char *text = "Hello World";
        // draw_list->AddText({rect_pos_x, 100}, IM_COL32_WHITE, text, text +
        // 8);

        // ImDrawList *foreground_list = ImGui::GetForegroundDrawList();
        // foreground_list->AddLine({0, 0}, {300, 300}, ImColor(255, 0, 0), 4);

        // ImGui::End();

        // ImGui::PopStyleVar();

        ImGui::Begin("Other Window");
        ImGui::SliderInt("A", &state.a, 0, 100);
        push_undo_after_edit();
        ImGui::End();

        ImGui::Render();

        glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
        ImGui_ImplOpenGL3_RenderDrawData(ImGui::GetDrawData());
        glfwSwapBuffers(window);

        z_was_down = z_is_down;
        // last_mouse_x = mouse_x;
        // last_mouse_y = mouse_y;
    }

    ImGui_ImplGlfw_Shutdown();
    glfwDestroyWindow(window);
    glfwTerminate();

    return 0;
}